

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O0

void jinit_c_prep_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int in_ESI;
  long *in_RDI;
  j_compress_ptr unaff_retaddr;
  jpeg_component_info *compptr;
  int ci;
  my_prep_ptr prep;
  long local_28;
  int local_1c;
  
  if (in_ESI != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 4;
    (**(code **)*in_RDI)(in_RDI);
  }
  puVar1 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x70);
  in_RDI[0x38] = (long)puVar1;
  *puVar1 = start_pass_prep;
  if (*(int *)(in_RDI[0x3c] + 0x10) == 0) {
    puVar1[1] = pre_process_data;
    local_1c = 0;
    local_28 = in_RDI[0xb];
    for (; local_1c < *(int *)((long)in_RDI + 0x4c); local_1c = local_1c + 1) {
      uVar2 = (**(code **)(in_RDI[1] + 0x10))
                        (in_RDI,1,(long)((ulong)*(uint *)(local_28 + 0x1c) * 8 *
                                        (long)(int)in_RDI[0x27]) / (long)*(int *)(local_28 + 8) &
                                  0xffffffff,*(undefined4 *)((long)in_RDI + 0x13c));
      puVar1[(long)local_1c + 2] = uVar2;
      local_28 = local_28 + 0x60;
    }
  }
  else {
    puVar1[1] = pre_process_context;
    create_context_buffer(unaff_retaddr);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_prep_controller(j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_prep_ptr prep;
  int ci;
  jpeg_component_info *compptr;

  if (need_full_buffer)         /* safety check */
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  prep = (my_prep_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_prep_controller));
  cinfo->prep = (struct jpeg_c_prep_controller *)prep;
  prep->pub.start_pass = start_pass_prep;

  /* Allocate the color conversion buffer.
   * We make the buffer wide enough to allow the downsampler to edge-expand
   * horizontally within the buffer, if it so chooses.
   */
  if (cinfo->downsample->need_context_rows) {
    /* Set up to provide context rows */
#ifdef CONTEXT_ROWS_SUPPORTED
    prep->pub.pre_process_data = pre_process_context;
    create_context_buffer(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    /* No context, just make it tall enough for one row group */
    prep->pub.pre_process_data = pre_process_data;
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      prep->color_buf[ci] = (*cinfo->mem->alloc_sarray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE,
         (JDIMENSION)(((long)compptr->width_in_blocks * DCTSIZE *
                       cinfo->max_h_samp_factor) / compptr->h_samp_factor),
         (JDIMENSION)cinfo->max_v_samp_factor);
    }
  }
}